

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

Transform *
pbrt::Rotate(Transform *__return_storage_ptr__,Float sinTheta,Float cosTheta,Vector3f *axis)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  Vector3<float> VVar15;
  SquareMatrix<4> m;
  SquareMatrix<4> local_50;
  
  auVar9 = in_register_00001204._4_56_;
  VVar15 = Normalize<float>(axis);
  fVar10 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  auVar6 = auVar8._0_16_;
  SquareMatrix<4>::SquareMatrix(&local_50);
  auVar7 = SUB6416(ZEXT464(0x3f800000),0);
  auVar5 = vfnmadd213ss_fma(auVar6,auVar6,auVar7);
  fVar1 = 1.0 - cosTheta;
  fVar14 = VVar15.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * cosTheta)),auVar6,auVar6);
  local_50.m[0][0] = auVar5._0_4_;
  auVar5 = vmovshdup_avx(auVar6);
  fVar11 = auVar5._0_4_;
  auVar13 = ZEXT416((uint)fVar10);
  auVar3 = vfmsub213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar14 * fVar11)),
                           ZEXT416((uint)(fVar10 * sinTheta)));
  auVar6 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar14 * fVar10)),
                           ZEXT416((uint)(fVar11 * sinTheta)));
  auVar12 = ZEXT416((uint)fVar1);
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)(fVar14 * fVar11)),auVar12,
                           ZEXT416((uint)(fVar10 * sinTheta)));
  auVar4 = vfmsub213ss_fma(ZEXT416((uint)(fVar14 * fVar10)),auVar12,
                           ZEXT416((uint)(fVar11 * sinTheta)));
  local_50.m[0][1] = auVar3._0_4_;
  local_50.m[0][2] = auVar6._0_4_;
  local_50.m[0][3] = 0.0;
  local_50.m[1][0] = auVar2._0_4_;
  auVar6 = vfnmadd213ss_fma(auVar5,auVar5,auVar7);
  auVar2 = vfnmadd231ss_fma(auVar7,auVar13,auVar13);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(cosTheta * auVar6._0_4_)),auVar5,auVar5);
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(cosTheta * auVar2._0_4_)),auVar13,auVar13);
  auVar3 = vfmsub213ss_fma(auVar12,ZEXT416((uint)(fVar10 * fVar11)),
                           ZEXT416((uint)(fVar14 * sinTheta)));
  auVar5 = vfmadd213ss_fma(auVar12,ZEXT416((uint)(fVar10 * fVar11)),
                           ZEXT416((uint)(fVar14 * sinTheta)));
  local_50.m[1][1] = auVar6._0_4_;
  local_50.m[1][2] = auVar3._0_4_;
  local_50.m[1][3] = 0.0;
  local_50.m[2][0] = auVar4._0_4_;
  local_50.m[2][1] = auVar5._0_4_;
  local_50.m[2][2] = auVar2._0_4_;
  local_50.m[2][3] = 0.0;
  Transpose<4>(&__return_storage_ptr__->mInv,&local_50);
  *(ulong *)(__return_storage_ptr__->m).m[0] = CONCAT44(local_50.m[0][1],local_50.m[0][0]);
  *(ulong *)((__return_storage_ptr__->m).m[0] + 2) = CONCAT44(local_50.m[0][3],local_50.m[0][2]);
  *(ulong *)(__return_storage_ptr__->m).m[1] = CONCAT44(local_50.m[1][1],local_50.m[1][0]);
  *(ulong *)((__return_storage_ptr__->m).m[1] + 2) = CONCAT44(local_50.m[1][3],local_50.m[1][2]);
  *(ulong *)(__return_storage_ptr__->m).m[2] = CONCAT44(local_50.m[2][1],local_50.m[2][0]);
  *(ulong *)((__return_storage_ptr__->m).m[2] + 2) = CONCAT44(local_50.m[2][3],local_50.m[2][2]);
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_50.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_50.m[3]._8_8_;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
inline Transform Rotate(Float sinTheta, Float cosTheta, const Vector3f &axis) {
    Vector3f a = Normalize(axis);
    SquareMatrix<4> m;
    // Compute rotation of first basis vector
    m[0][0] = a.x * a.x + (1 - a.x * a.x) * cosTheta;
    m[0][1] = a.x * a.y * (1 - cosTheta) - a.z * sinTheta;
    m[0][2] = a.x * a.z * (1 - cosTheta) + a.y * sinTheta;
    m[0][3] = 0;

    // Compute rotations of second and third basis vectors
    m[1][0] = a.x * a.y * (1 - cosTheta) + a.z * sinTheta;
    m[1][1] = a.y * a.y + (1 - a.y * a.y) * cosTheta;
    m[1][2] = a.y * a.z * (1 - cosTheta) - a.x * sinTheta;
    m[1][3] = 0;

    m[2][0] = a.x * a.z * (1 - cosTheta) - a.y * sinTheta;
    m[2][1] = a.y * a.z * (1 - cosTheta) + a.x * sinTheta;
    m[2][2] = a.z * a.z + (1 - a.z * a.z) * cosTheta;
    m[2][3] = 0;

    return Transform(m, Transpose(m));
}